

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeBlendFactorComputeA
          (FragmentProcessor *this,Vec4 *blendColor,BlendState *blendAState)

{
  float fVar1;
  Vec4 *dst_37;
  Vec4 *src1_37;
  Vec4 *src_37;
  int regSampleNdx_37;
  Vec4 *dst_36;
  Vec4 *src1_36;
  Vec4 *src_36;
  int regSampleNdx_36;
  Vec4 *dst_35;
  Vec4 *src1_35;
  Vec4 *src_35;
  int regSampleNdx_35;
  Vec4 *dst_34;
  Vec4 *src1_34;
  Vec4 *src_34;
  int regSampleNdx_34;
  Vec4 *dst_33;
  Vec4 *src1_33;
  Vec4 *src_33;
  int regSampleNdx_33;
  Vec4 *dst_32;
  Vec4 *src1_32;
  Vec4 *src_32;
  int regSampleNdx_32;
  Vec4 *dst_31;
  Vec4 *src1_31;
  Vec4 *src_31;
  int regSampleNdx_31;
  Vec4 *dst_30;
  Vec4 *src1_30;
  Vec4 *src_30;
  int regSampleNdx_30;
  Vec4 *dst_29;
  Vec4 *src1_29;
  Vec4 *src_29;
  int regSampleNdx_29;
  Vec4 *dst_28;
  Vec4 *src1_28;
  Vec4 *src_28;
  int regSampleNdx_28;
  Vec4 *dst_27;
  Vec4 *src1_27;
  Vec4 *src_27;
  int regSampleNdx_27;
  Vec4 *dst_26;
  Vec4 *src1_26;
  Vec4 *src_26;
  int regSampleNdx_26;
  Vec4 *dst_25;
  Vec4 *src1_25;
  Vec4 *src_25;
  int regSampleNdx_25;
  Vec4 *dst_24;
  Vec4 *src1_24;
  Vec4 *src_24;
  int regSampleNdx_24;
  Vec4 *dst_23;
  Vec4 *src1_23;
  Vec4 *src_23;
  int regSampleNdx_23;
  Vec4 *dst_22;
  Vec4 *src1_22;
  Vec4 *src_22;
  int regSampleNdx_22;
  Vec4 *dst_21;
  Vec4 *src1_21;
  Vec4 *src_21;
  int regSampleNdx_21;
  Vec4 *dst_20;
  Vec4 *src1_20;
  Vec4 *src_20;
  int regSampleNdx_20;
  Vec4 *dst_19;
  Vec4 *src1_19;
  Vec4 *src_19;
  int regSampleNdx_19;
  Vec4 *dst_18;
  Vec4 *src1_18;
  Vec4 *src_18;
  int regSampleNdx_18;
  Vec4 *dst_17;
  Vec4 *src1_17;
  Vec4 *src_17;
  int regSampleNdx_17;
  Vec4 *dst_16;
  Vec4 *src1_16;
  Vec4 *src_16;
  int regSampleNdx_16;
  Vec4 *dst_15;
  Vec4 *src1_15;
  Vec4 *src_15;
  int regSampleNdx_15;
  Vec4 *dst_14;
  Vec4 *src1_14;
  Vec4 *src_14;
  int regSampleNdx_14;
  Vec4 *dst_13;
  Vec4 *src1_13;
  Vec4 *src_13;
  int regSampleNdx_13;
  Vec4 *dst_12;
  Vec4 *src1_12;
  Vec4 *src_12;
  int regSampleNdx_12;
  Vec4 *dst_11;
  Vec4 *src1_11;
  Vec4 *src_11;
  int regSampleNdx_11;
  Vec4 *dst_10;
  Vec4 *src1_10;
  Vec4 *src_10;
  int regSampleNdx_10;
  Vec4 *dst_9;
  Vec4 *src1_9;
  Vec4 *src_9;
  int regSampleNdx_9;
  Vec4 *dst_8;
  Vec4 *src1_8;
  Vec4 *src_8;
  int regSampleNdx_8;
  Vec4 *dst_7;
  Vec4 *src1_7;
  Vec4 *src_7;
  int regSampleNdx_7;
  Vec4 *dst_6;
  Vec4 *src1_6;
  Vec4 *src_6;
  int regSampleNdx_6;
  Vec4 *dst_5;
  Vec4 *src1_5;
  Vec4 *src_5;
  int regSampleNdx_5;
  Vec4 *dst_4;
  Vec4 *src1_4;
  Vec4 *src_4;
  int regSampleNdx_4;
  Vec4 *dst_3;
  Vec4 *src1_3;
  Vec4 *src_3;
  int regSampleNdx_3;
  Vec4 *dst_2;
  Vec4 *src1_2;
  Vec4 *src_2;
  int regSampleNdx_2;
  Vec4 *dst_1;
  Vec4 *src1_1;
  Vec4 *src_1;
  int regSampleNdx_1;
  Vec4 *dst;
  Vec4 *src1;
  Vec4 *src;
  int regSampleNdx;
  BlendState *blendAState_local;
  Vec4 *blendColor_local;
  FragmentProcessor *this_local;
  
  switch(blendAState->srcFunc) {
  case BLENDFUNC_ZERO:
    for (src._4_4_ = 0; src._4_4_ < 0x40; src._4_4_ = src._4_4_ + 1) {
      if ((this->m_sampleRegister[src._4_4_].isAlive & 1U) != 0) {
        this->m_sampleRegister[src._4_4_].blendSrcFactorA = 0.0;
      }
    }
    break;
  case BLENDFUNC_ONE:
    for (src_1._4_4_ = 0; src_1._4_4_ < 0x40; src_1._4_4_ = src_1._4_4_ + 1) {
      if ((this->m_sampleRegister[src_1._4_4_].isAlive & 1U) != 0) {
        this->m_sampleRegister[src_1._4_4_].blendSrcFactorA = 1.0;
      }
    }
    break;
  case BLENDFUNC_SRC_COLOR:
    for (src_2._4_4_ = 0; src_2._4_4_ < 0x40; src_2._4_4_ = src_2._4_4_ + 1) {
      if ((this->m_sampleRegister[src_2._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_2._4_4_].clampedBlendSrcColor);
        this->m_sampleRegister[src_2._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    for (src_3._4_4_ = 0; src_3._4_4_ < 0x40; src_3._4_4_ = src_3._4_4_ + 1) {
      if ((this->m_sampleRegister[src_3._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_3._4_4_].clampedBlendSrcColor);
        this->m_sampleRegister[src_3._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_DST_COLOR:
    for (src_4._4_4_ = 0; src_4._4_4_ < 0x40; src_4._4_4_ = src_4._4_4_ + 1) {
      if ((this->m_sampleRegister[src_4._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_4._4_4_].clampedBlendDstColor);
        this->m_sampleRegister[src_4._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    for (src_5._4_4_ = 0; src_5._4_4_ < 0x40; src_5._4_4_ = src_5._4_4_ + 1) {
      if ((this->m_sampleRegister[src_5._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_5._4_4_].clampedBlendDstColor);
        this->m_sampleRegister[src_5._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA:
    for (src_6._4_4_ = 0; src_6._4_4_ < 0x40; src_6._4_4_ = src_6._4_4_ + 1) {
      if ((this->m_sampleRegister[src_6._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_6._4_4_].clampedBlendSrcColor);
        this->m_sampleRegister[src_6._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    for (src_7._4_4_ = 0; src_7._4_4_ < 0x40; src_7._4_4_ = src_7._4_4_ + 1) {
      if ((this->m_sampleRegister[src_7._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_7._4_4_].clampedBlendSrcColor);
        this->m_sampleRegister[src_7._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_DST_ALPHA:
    for (src_8._4_4_ = 0; src_8._4_4_ < 0x40; src_8._4_4_ = src_8._4_4_ + 1) {
      if ((this->m_sampleRegister[src_8._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_8._4_4_].clampedBlendDstColor);
        this->m_sampleRegister[src_8._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    for (src_9._4_4_ = 0; src_9._4_4_ < 0x40; src_9._4_4_ = src_9._4_4_ + 1) {
      if ((this->m_sampleRegister[src_9._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_9._4_4_].clampedBlendDstColor);
        this->m_sampleRegister[src_9._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    for (src_10._4_4_ = 0; src_10._4_4_ < 0x40; src_10._4_4_ = src_10._4_4_ + 1) {
      if ((this->m_sampleRegister[src_10._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_10._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    for (src_11._4_4_ = 0; src_11._4_4_ < 0x40; src_11._4_4_ = src_11._4_4_ + 1) {
      if ((this->m_sampleRegister[src_11._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_11._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    for (src_12._4_4_ = 0; src_12._4_4_ < 0x40; src_12._4_4_ = src_12._4_4_ + 1) {
      if ((this->m_sampleRegister[src_12._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_12._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    for (src_13._4_4_ = 0; src_13._4_4_ < 0x40; src_13._4_4_ = src_13._4_4_ + 1) {
      if ((this->m_sampleRegister[src_13._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_13._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    for (src_14._4_4_ = 0; src_14._4_4_ < 0x40; src_14._4_4_ = src_14._4_4_ + 1) {
      if ((this->m_sampleRegister[src_14._4_4_].isAlive & 1U) != 0) {
        this->m_sampleRegister[src_14._4_4_].blendSrcFactorA = 1.0;
      }
    }
    break;
  case BLENDFUNC_SRC1_COLOR:
    for (src_15._4_4_ = 0; src_15._4_4_ < 0x40; src_15._4_4_ = src_15._4_4_ + 1) {
      if ((this->m_sampleRegister[src_15._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_15._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_15._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    for (src_16._4_4_ = 0; src_16._4_4_ < 0x40; src_16._4_4_ = src_16._4_4_ + 1) {
      if ((this->m_sampleRegister[src_16._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_16._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_16._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_SRC1_ALPHA:
    for (src_17._4_4_ = 0; src_17._4_4_ < 0x40; src_17._4_4_ = src_17._4_4_ + 1) {
      if ((this->m_sampleRegister[src_17._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_17._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_17._4_4_].blendSrcFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    for (src_18._4_4_ = 0; src_18._4_4_ < 0x40; src_18._4_4_ = src_18._4_4_ + 1) {
      if ((this->m_sampleRegister[src_18._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_18._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_18._4_4_].blendSrcFactorA = 1.0 - fVar1;
      }
    }
  }
  switch(blendAState->dstFunc) {
  case BLENDFUNC_ZERO:
    for (src_19._4_4_ = 0; src_19._4_4_ < 0x40; src_19._4_4_ = src_19._4_4_ + 1) {
      if ((this->m_sampleRegister[src_19._4_4_].isAlive & 1U) != 0) {
        this->m_sampleRegister[src_19._4_4_].blendDstFactorA = 0.0;
      }
    }
    break;
  case BLENDFUNC_ONE:
    for (src_20._4_4_ = 0; src_20._4_4_ < 0x40; src_20._4_4_ = src_20._4_4_ + 1) {
      if ((this->m_sampleRegister[src_20._4_4_].isAlive & 1U) != 0) {
        this->m_sampleRegister[src_20._4_4_].blendDstFactorA = 1.0;
      }
    }
    break;
  case BLENDFUNC_SRC_COLOR:
    for (src_21._4_4_ = 0; src_21._4_4_ < 0x40; src_21._4_4_ = src_21._4_4_ + 1) {
      if ((this->m_sampleRegister[src_21._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_21._4_4_].clampedBlendSrcColor)
        ;
        this->m_sampleRegister[src_21._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    for (src_22._4_4_ = 0; src_22._4_4_ < 0x40; src_22._4_4_ = src_22._4_4_ + 1) {
      if ((this->m_sampleRegister[src_22._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_22._4_4_].clampedBlendSrcColor)
        ;
        this->m_sampleRegister[src_22._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_DST_COLOR:
    for (src_23._4_4_ = 0; src_23._4_4_ < 0x40; src_23._4_4_ = src_23._4_4_ + 1) {
      if ((this->m_sampleRegister[src_23._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_23._4_4_].clampedBlendDstColor)
        ;
        this->m_sampleRegister[src_23._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    for (src_24._4_4_ = 0; src_24._4_4_ < 0x40; src_24._4_4_ = src_24._4_4_ + 1) {
      if ((this->m_sampleRegister[src_24._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_24._4_4_].clampedBlendDstColor)
        ;
        this->m_sampleRegister[src_24._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA:
    for (src_25._4_4_ = 0; src_25._4_4_ < 0x40; src_25._4_4_ = src_25._4_4_ + 1) {
      if ((this->m_sampleRegister[src_25._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_25._4_4_].clampedBlendSrcColor)
        ;
        this->m_sampleRegister[src_25._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    for (src_26._4_4_ = 0; src_26._4_4_ < 0x40; src_26._4_4_ = src_26._4_4_ + 1) {
      if ((this->m_sampleRegister[src_26._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_26._4_4_].clampedBlendSrcColor)
        ;
        this->m_sampleRegister[src_26._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_DST_ALPHA:
    for (src_27._4_4_ = 0; src_27._4_4_ < 0x40; src_27._4_4_ = src_27._4_4_ + 1) {
      if ((this->m_sampleRegister[src_27._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_27._4_4_].clampedBlendDstColor)
        ;
        this->m_sampleRegister[src_27._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    for (src_28._4_4_ = 0; src_28._4_4_ < 0x40; src_28._4_4_ = src_28._4_4_ + 1) {
      if ((this->m_sampleRegister[src_28._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(&this->m_sampleRegister[src_28._4_4_].clampedBlendDstColor)
        ;
        this->m_sampleRegister[src_28._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    for (src_29._4_4_ = 0; src_29._4_4_ < 0x40; src_29._4_4_ = src_29._4_4_ + 1) {
      if ((this->m_sampleRegister[src_29._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_29._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    for (src_30._4_4_ = 0; src_30._4_4_ < 0x40; src_30._4_4_ = src_30._4_4_ + 1) {
      if ((this->m_sampleRegister[src_30._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_30._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    for (src_31._4_4_ = 0; src_31._4_4_ < 0x40; src_31._4_4_ = src_31._4_4_ + 1) {
      if ((this->m_sampleRegister[src_31._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_31._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    for (src_32._4_4_ = 0; src_32._4_4_ < 0x40; src_32._4_4_ = src_32._4_4_ + 1) {
      if ((this->m_sampleRegister[src_32._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w(blendColor);
        this->m_sampleRegister[src_32._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    for (src_33._4_4_ = 0; src_33._4_4_ < 0x40; src_33._4_4_ = src_33._4_4_ + 1) {
      if ((this->m_sampleRegister[src_33._4_4_].isAlive & 1U) != 0) {
        this->m_sampleRegister[src_33._4_4_].blendDstFactorA = 1.0;
      }
    }
    break;
  case BLENDFUNC_SRC1_COLOR:
    for (src_34._4_4_ = 0; src_34._4_4_ < 0x40; src_34._4_4_ = src_34._4_4_ + 1) {
      if ((this->m_sampleRegister[src_34._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_34._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_34._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    for (src_35._4_4_ = 0; src_35._4_4_ < 0x40; src_35._4_4_ = src_35._4_4_ + 1) {
      if ((this->m_sampleRegister[src_35._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_35._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_35._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
    break;
  case BLENDFUNC_SRC1_ALPHA:
    for (src_36._4_4_ = 0; src_36._4_4_ < 0x40; src_36._4_4_ = src_36._4_4_ + 1) {
      if ((this->m_sampleRegister[src_36._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_36._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_36._4_4_].blendDstFactorA = fVar1;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    for (src_37._4_4_ = 0; src_37._4_4_ < 0x40; src_37._4_4_ = src_37._4_4_ + 1) {
      if ((this->m_sampleRegister[src_37._4_4_].isAlive & 1U) != 0) {
        fVar1 = tcu::Vector<float,_4>::w
                          (&this->m_sampleRegister[src_37._4_4_].clampedBlendSrc1Color);
        this->m_sampleRegister[src_37._4_4_].blendDstFactorA = 1.0 - fVar1;
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeBlendFactorComputeA (const Vec4& blendColor, const BlendState& blendAState)
{
#define SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, FACTOR_EXPRESSION)														\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)											\
	{																														\
		if (m_sampleRegister[regSampleNdx].isAlive)																			\
		{																													\
			const Vec4& src		= m_sampleRegister[regSampleNdx].clampedBlendSrcColor;										\
			const Vec4& src1	= m_sampleRegister[regSampleNdx].clampedBlendSrc1Color;										\
			const Vec4& dst		= m_sampleRegister[regSampleNdx].clampedBlendDstColor;										\
			DE_UNREF(src);																									\
			DE_UNREF(src1);																									\
			DE_UNREF(dst);																									\
																															\
			m_sampleRegister[regSampleNdx].FACTOR_NAME = (FACTOR_EXPRESSION);												\
		}																													\
	}

#define SWITCH_SRC_OR_DST_FACTOR_A(FUNC_NAME, FACTOR_NAME)																		\
	switch (blendAState.FUNC_NAME)																								\
	{																															\
		case BLENDFUNC_ZERO:						SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 0.0f)						break;	\
		case BLENDFUNC_ONE:							SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f)						break;	\
		case BLENDFUNC_SRC_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src.w())			break;	\
		case BLENDFUNC_DST_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.w())					break;	\
		case BLENDFUNC_ONE_MINUS_DST_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - dst.w())			break;	\
		case BLENDFUNC_SRC_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src.w())			break;	\
		case BLENDFUNC_DST_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.w())					break;	\
		case BLENDFUNC_ONE_MINUS_DST_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - dst.w())			break;	\
		case BLENDFUNC_CONSTANT_COLOR:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.w())			break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - blendColor.w())	break;	\
		case BLENDFUNC_CONSTANT_ALPHA:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.w())			break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - blendColor.w())	break;	\
		case BLENDFUNC_SRC_ALPHA_SATURATE:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f)						break;	\
		case BLENDFUNC_SRC1_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_COLOR:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src1.w())			break;	\
		case BLENDFUNC_SRC1_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src1.w())			break;	\
		default:																												\
			DE_ASSERT(false);																									\
	}

	SWITCH_SRC_OR_DST_FACTOR_A(srcFunc, blendSrcFactorA)
	SWITCH_SRC_OR_DST_FACTOR_A(dstFunc, blendDstFactorA)

#undef SWITCH_SRC_OR_DST_FACTOR_A
#undef SAMPLE_REGISTER_BLEND_FACTOR
}